

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffparse.c
# Opt level: O0

FT_Error cff_parse_private_dict(CFF_Parser parser)

{
  void *pvVar1;
  FT_Byte **d;
  FT_Long FVar2;
  FT_Long tmp;
  FT_Error error;
  FT_Byte **data;
  CFF_FontRecDict dict;
  CFF_Parser parser_local;
  
  pvVar1 = parser->object;
  d = parser->stack;
  tmp._4_4_ = 0xa1;
  if (parser->stack + 2 <= parser->top) {
    FVar2 = cff_parse_num(parser,d);
    if (FVar2 < 0) {
      tmp._4_4_ = 3;
    }
    else {
      *(FT_Long *)((long)pvVar1 + 0xd0) = FVar2;
      FVar2 = cff_parse_num(parser,d + 1);
      if (FVar2 < 0) {
        tmp._4_4_ = 3;
      }
      else {
        *(FT_Long *)((long)pvVar1 + 200) = FVar2;
        tmp._4_4_ = 0;
      }
    }
  }
  return tmp._4_4_;
}

Assistant:

static FT_Error
  cff_parse_private_dict( CFF_Parser  parser )
  {
    CFF_FontRecDict  dict = (CFF_FontRecDict)parser->object;
    FT_Byte**        data = parser->stack;
    FT_Error         error;


    error = FT_ERR( Stack_Underflow );

    if ( parser->top >= parser->stack + 2 )
    {
      FT_Long  tmp;


      tmp = cff_parse_num( parser, data++ );
      if ( tmp < 0 )
      {
        FT_ERROR(( "cff_parse_private_dict: Invalid dictionary size\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Fail;
      }
      dict->private_size = (FT_ULong)tmp;

      tmp = cff_parse_num( parser, data );
      if ( tmp < 0 )
      {
        FT_ERROR(( "cff_parse_private_dict: Invalid dictionary offset\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Fail;
      }
      dict->private_offset = (FT_ULong)tmp;

      FT_TRACE4(( " %lu %lu\n",
                  dict->private_size, dict->private_offset ));

      error = FT_Err_Ok;
    }

  Fail:
    return error;
  }